

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O2

sizes xor8(size_t n)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  size_t __size;
  int iVar4;
  uint uVar5;
  size_t i;
  void *__ptr;
  uint64_t *keys;
  uint64_t uVar6;
  void *__s;
  void *__ptr_00;
  void *__ptr_01;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  ulong uVar15;
  size_t i_2;
  long lVar16;
  size_t sVar17;
  byte bVar18;
  size_t i_3;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  size_t i_1;
  ulong uVar24;
  size_t capacity;
  size_t sVar25;
  size_t sVar26;
  ulong uVar27;
  double dVar28;
  sizes sVar29;
  ulong local_98;
  uint64_t local_78;
  uint64_t local_38;
  
  dVar28 = (double)(n & 0xffffffff) * 1.23 + 32.0;
  uVar11 = (ulong)dVar28;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(dVar28 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
  uVar11 = SUB168(auVar3 / ZEXT816(3),0);
  __size = uVar11 * 3;
  __ptr = malloc(__size);
  if (__ptr == (void *)0x0) {
    puts("allocation failed");
    sVar26 = 0;
    sVar17 = 0;
  }
  else {
    keys = (uint64_t *)malloc(n * 8);
    for (uVar6 = 0; n != uVar6; uVar6 = uVar6 + 1) {
      keys[uVar6] = uVar6;
    }
    if ((int)n != 0) {
      local_38 = 1;
      local_78 = xor_rng_splitmix64(&local_38);
      sVar25 = uVar11 * 0x30;
      __s = malloc(sVar25);
      __ptr_00 = malloc(sVar25);
      __ptr_01 = malloc((n & 0xffffffff) << 4);
      if (__ptr_01 != (void *)0x0 && (__ptr_00 != (void *)0x0 && __s != (void *)0x0)) {
        lVar7 = uVar11 * 0x10;
        lVar12 = uVar11 * 0x20;
        iVar4 = SUB164(auVar3 / ZEXT816(3),0);
        uVar27 = uVar11 & 0xffffffff;
        uVar5 = 0;
        local_98 = n;
        do {
          if (uVar5 + 1 == 10) {
            local_98 = xor_sort_and_remove_dup(keys,local_98 & 0xffffffff);
          }
          else if (99 < uVar5) break;
          memset(__s,0,sVar25);
          uVar8 = local_98 & 0xffffffff;
          for (uVar24 = 0; uVar8 != uVar24; uVar24 = uVar24 + 1) {
            uVar6 = xor_mix_split(keys[uVar24],local_78);
            uVar19 = (uVar6 & 0xffffffff) * uVar27 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar19);
            *puVar1 = *puVar1 ^ uVar6;
            piVar9 = (int *)((long)__s + uVar19 + 8);
            *piVar9 = *piVar9 + 1;
            uVar19 = ((uint)(uVar6 << 0x15) | (uint)(uVar6 >> 0x2b)) * uVar27 >> 0x1c &
                     0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar19 + lVar7);
            *puVar1 = *puVar1 ^ uVar6;
            piVar9 = (int *)((long)__s + uVar19 + lVar7 + 8);
            *piVar9 = *piVar9 + 1;
            uVar19 = (uVar6 >> 0x16 & 0xffffffff) * uVar27 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar19 + lVar12);
            *puVar1 = *puVar1 ^ uVar6;
            piVar9 = (int *)((long)__s + uVar19 + lVar12 + 8);
            *piVar9 = *piVar9 + 1;
          }
          lVar13 = 0;
          piVar9 = (int *)((long)__s + 8);
          for (uVar24 = 0; uVar11 != uVar24; uVar24 = uVar24 + 1) {
            if (*piVar9 == 1) {
              *(int *)((long)__ptr_00 + lVar13 * 0x10 + 8) = (int)uVar24;
              *(undefined8 *)((long)__ptr_00 + lVar13 * 0x10) = *(undefined8 *)(piVar9 + -2);
              lVar13 = lVar13 + 1;
            }
            piVar9 = piVar9 + 4;
          }
          lVar10 = 0;
          piVar9 = (int *)((long)__s + lVar7 + 8);
          for (uVar24 = 0; uVar11 != uVar24; uVar24 = uVar24 + 1) {
            if (*piVar9 == 1) {
              *(int *)((long)__ptr_00 + lVar10 * 0x10 + lVar7 + 8) = (int)uVar24;
              *(undefined8 *)((long)__ptr_00 + lVar10 * 0x10 + lVar7) = *(undefined8 *)(piVar9 + -2)
              ;
              lVar10 = lVar10 + 1;
            }
            piVar9 = piVar9 + 4;
          }
          lVar16 = 0;
          piVar9 = (int *)((long)__s + lVar12 + 8);
          for (uVar24 = 0; uVar11 != uVar24; uVar24 = uVar24 + 1) {
            if (*piVar9 == 1) {
              *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar12 + 8) = (int)uVar24;
              *(undefined8 *)((long)__ptr_00 + lVar16 * 0x10 + lVar12) =
                   *(undefined8 *)(piVar9 + -2);
              lVar16 = lVar16 + 1;
            }
            piVar9 = piVar9 + 4;
          }
          uVar24 = 0;
LAB_00102c7c:
          if (lVar13 + lVar10 + lVar16 != 0) {
            do {
              lVar20 = -lVar13;
              puVar1 = (ulong *)(lVar13 * 0x10 + (long)__ptr_00);
              do {
                puVar14 = puVar1;
                lVar20 = lVar20 + 1;
                if (lVar20 == 1) {
                  lVar13 = 0;
                  goto LAB_00102d8b;
                }
                uVar19 = puVar14[-1];
                puVar1 = puVar14 + -2;
              } while (*(int *)((long)__s + (ulong)(uint)uVar19 * 0x10 + 8) == 0);
              uVar21 = puVar14[-2];
              uVar2 = *(undefined4 *)((long)puVar14 + -4);
              uVar15 = ((uint)(uVar21 << 0x15) | (uint)(uVar21 >> 0x2b)) * uVar27;
              lVar13 = uVar24 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar13) = uVar21;
              *(uint *)((long)__ptr_01 + lVar13 + 8) = (uint)uVar19;
              *(undefined4 *)((long)__ptr_01 + lVar13 + 0xc) = uVar2;
              lVar13 = (uVar15 >> 0x20) * 0x10;
              uVar19 = *(ulong *)((long)__s + lVar13 + lVar7) ^ uVar21;
              *(ulong *)((long)__s + lVar13 + lVar7) = uVar19;
              iVar23 = *(int *)((long)__s + lVar13 + lVar7 + 8) + -1;
              *(int *)((long)__s + lVar13 + lVar7 + 8) = iVar23;
              if (iVar23 == 1) {
                *(int *)((long)__ptr_00 + lVar10 * 0x10 + lVar7 + 8) = (int)(uVar15 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar10 * 0x10 + lVar7) = uVar19;
                lVar10 = lVar10 + 1;
              }
              uVar19 = (uVar21 >> 0x16 & 0xffffffff) * uVar27;
              uVar24 = uVar24 + 1;
              lVar13 = -lVar20;
              lVar22 = (uVar19 >> 0x20) * 0x10;
              uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar22 + lVar12);
              *(ulong *)((long)__s + lVar22 + lVar12) = uVar21;
              iVar23 = *(int *)((long)__s + lVar22 + lVar12 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar12 + 8) = iVar23;
              if (iVar23 == 1) {
                *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar12 + 8) = (int)(uVar19 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar12) = uVar21;
                lVar16 = lVar16 + 1;
                lVar13 = -lVar20;
              }
            } while( true );
          }
          if (uVar24 == uVar8) {
            for (lVar7 = uVar8 << 4; lVar7 != 0; lVar7 = lVar7 + -0x10) {
              uVar8 = *(ulong *)((long)__ptr_01 + lVar7 + -0x10);
              uVar24 = (ulong)*(uint *)((long)__ptr_01 + lVar7 + -8);
              if (uVar24 < uVar11) {
                bVar18 = *(byte *)((long)__ptr +
                                  (((uint)(uVar8 << 0x15) | (uint)(uVar8 >> 0x2b)) * uVar27 >> 0x20)
                                  + uVar11);
LAB_0010300e:
                uVar21 = uVar8 >> 0x16;
                uVar19 = uVar11 * 2;
              }
              else {
                bVar18 = *(byte *)((long)__ptr + ((uVar8 & 0xffffffff) * uVar27 >> 0x20));
                if (uVar24 < uVar11 * 2) goto LAB_0010300e;
                uVar21 = uVar8 << 0x15 | uVar8 >> 0x2b;
                uVar19 = uVar11;
              }
              *(byte *)((long)__ptr + uVar24) =
                   (byte)(uVar8 >> 0x20) ^ (byte)uVar8 ^ bVar18 ^
                   *(byte *)((long)__ptr + ((uVar21 & 0xffffffff) * uVar27 >> 0x20) + uVar19);
            }
            free(__s);
            free(__ptr_00);
            free(__ptr_01);
            goto LAB_0010306c;
          }
          local_78 = xor_rng_splitmix64(&local_38);
          uVar5 = uVar5 + 1;
        } while( true );
      }
      free(__s);
      free(__ptr_00);
      free(__ptr_01);
    }
    puts("populating failed");
LAB_0010306c:
    free(keys);
    sVar17 = (__size + 7 >> 3) + 0x10;
    for (sVar25 = 0; __size != sVar25; sVar25 = sVar25 + 1) {
      sVar17 = (sVar17 + 1) - (ulong)(*(char *)((long)__ptr + sVar25) == '\0');
    }
    sVar26 = __size + 0x10;
    free(__ptr);
  }
  sVar29.pack = sVar17;
  sVar29.standard = sVar26;
  return sVar29;
LAB_00102d8b:
  lVar20 = -lVar10;
  puVar1 = (ulong *)((long)__ptr_00 + lVar10 * 0x10 + lVar7);
  do {
    puVar14 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar10 = 0;
      goto LAB_00102e89;
    }
    uVar19 = puVar14[-1];
    puVar1 = puVar14 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar19 * 0x10 + lVar7 + 8) == 0);
  uVar21 = puVar14[-2];
  uVar2 = *(undefined4 *)((long)puVar14 + -4);
  uVar15 = (uVar21 & 0xffffffff) * uVar27;
  lVar10 = uVar24 * 0x10;
  *(ulong *)((long)__ptr_01 + lVar10) = uVar21;
  *(uint *)((long)__ptr_01 + lVar10 + 8) = (uint)uVar19 + iVar4;
  *(undefined4 *)((long)__ptr_01 + lVar10 + 0xc) = uVar2;
  lVar10 = (uVar15 >> 0x20) * 0x10;
  uVar19 = *(ulong *)((long)__s + lVar10) ^ uVar21;
  *(ulong *)((long)__s + lVar10) = uVar19;
  iVar23 = *(int *)((long)__s + lVar10 + 8) + -1;
  *(int *)((long)__s + lVar10 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar13 * 0x10 + 8) = (int)(uVar15 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar13 * 0x10) = uVar19;
    lVar13 = lVar13 + 1;
  }
  uVar19 = (uVar21 >> 0x16 & 0xffffffff) * uVar27;
  uVar24 = uVar24 + 1;
  lVar10 = -lVar20;
  lVar20 = (uVar19 >> 0x20) * 0x10;
  uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar20 + lVar12);
  *(ulong *)((long)__s + lVar20 + lVar12) = uVar21;
  iVar23 = *(int *)((long)__s + lVar20 + lVar12 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar12 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar12 + 8) = (int)(uVar19 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar12) = uVar21;
    lVar16 = lVar16 + 1;
  }
  goto LAB_00102d8b;
LAB_00102e89:
  lVar20 = -lVar16;
  puVar1 = (ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar12);
  do {
    puVar14 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar16 = 0;
      goto LAB_00102c7c;
    }
    uVar19 = puVar14[-1];
    puVar1 = puVar14 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar19 * 0x10 + lVar12 + 8) == 0);
  uVar21 = puVar14[-2];
  uVar2 = *(undefined4 *)((long)puVar14 + -4);
  uVar15 = (uVar21 & 0xffffffff) * uVar27;
  lVar16 = uVar24 * 0x10;
  *(ulong *)((long)__ptr_01 + lVar16) = uVar21;
  *(uint *)((long)__ptr_01 + lVar16 + 8) = (uint)uVar19 + iVar4 * 2;
  *(undefined4 *)((long)__ptr_01 + lVar16 + 0xc) = uVar2;
  lVar16 = (uVar15 >> 0x20) * 0x10;
  uVar19 = *(ulong *)((long)__s + lVar16) ^ uVar21;
  *(ulong *)((long)__s + lVar16) = uVar19;
  iVar23 = *(int *)((long)__s + lVar16 + 8) + -1;
  *(int *)((long)__s + lVar16 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar13 * 0x10 + 8) = (int)(uVar15 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar13 * 0x10) = uVar19;
    lVar13 = lVar13 + 1;
  }
  uVar19 = ((uint)(uVar21 << 0x15) | (uint)(uVar21 >> 0x2b)) * uVar27;
  uVar24 = uVar24 + 1;
  lVar16 = -lVar20;
  lVar20 = (uVar19 >> 0x20) * 0x10;
  uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar20 + lVar7);
  *(ulong *)((long)__s + lVar20 + lVar7) = uVar21;
  iVar23 = *(int *)((long)__s + lVar20 + lVar7 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar7 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar10 * 0x10 + lVar7 + 8) = (int)(uVar19 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar10 * 0x10 + lVar7) = uVar21;
    lVar10 = lVar10 + 1;
  }
  goto LAB_00102e89;
}

Assistant:

sizes xor8(size_t n) {
  xor8_t filter = {0};
  if (! xor8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor8_serialization_bytes(&filter),
    .pack = xor8_pack_bytes(&filter)
  };
  xor8_free(&filter);

  return s;
}